

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ip;
  int *pInLimit;
  BYTE *pBVar1;
  undefined8 *puVar2;
  U32 UVar3;
  U32 *pUVar4;
  seqDef *psVar5;
  undefined8 uVar6;
  uint uVar7;
  U32 lowestValid;
  uint uVar8;
  size_t sVar9;
  long lVar10;
  int *ip_00;
  int *iend;
  ulong uVar11;
  ulong uVar12;
  BYTE *pBVar13;
  uint uVar14;
  uint uVar15;
  ZSTD_matchState_t *ms_00;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  seqStore_t *psVar19;
  size_t offbaseFound;
  uint local_b8;
  uint local_b4;
  ZSTD_matchState_t *local_b0;
  uint local_a8;
  uint local_a4;
  int *local_a0;
  int *local_98;
  uint local_8c;
  ulong local_88;
  BYTE *local_80;
  BYTE *local_78;
  int *local_70;
  seqStore_t *local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  int *local_50;
  size_t local_48;
  BYTE *local_40;
  uint *local_38;
  
  local_80 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  local_40 = local_80 + uVar8;
  local_a4 = (ms->cParams).minMatch;
  if (5 < local_a4) {
    local_a4 = 6;
  }
  if (local_a4 < 5) {
    local_a4 = 4;
  }
  local_8c = (ms->cParams).searchLog;
  local_b4 = 6;
  if (local_8c < 6) {
    local_b4 = local_8c;
  }
  if (local_b4 < 5) {
    local_b4 = 4;
  }
  ip_00 = (int *)((ulong)((int)src == (int)local_40) + (long)src);
  uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar17 = (int)ip_00 - (int)local_80;
  local_58 = *rep;
  local_54 = iVar17 - uVar14;
  if (iVar17 - uVar8 <= uVar14) {
    local_54 = uVar8;
  }
  uVar14 = 0;
  if (ms->loadedDictEnd != 0) {
    local_54 = uVar8;
  }
  local_5c = rep[1];
  local_54 = iVar17 - local_54;
  local_a8 = local_5c;
  if (local_54 < local_5c) {
    local_a8 = uVar14;
  }
  local_b8 = local_58;
  if (local_54 < local_58) {
    local_b8 = uVar14;
  }
  ms->lazySkipping = 0;
  local_70 = (int *)((long)src + (srcSize - 0x10));
  uVar8 = ms->nextToUpdate;
  uVar18 = (ulong)uVar8;
  uVar15 = ((int)local_70 - (int)(local_80 + uVar18)) + 1;
  if (7 < uVar15) {
    uVar15 = 8;
  }
  if (local_70 < local_80 + uVar18) {
    uVar15 = uVar14;
  }
  pInLimit = (int *)((long)src + srcSize);
  UVar3 = ms->rowHashLog;
  local_a0 = (int *)(ulong)(0x38 - UVar3);
  local_78 = (BYTE *)CONCAT44(local_78._4_4_,0x18 - UVar3);
  local_48 = 1L << ((byte)local_b4 & 0x3f);
  local_88 = CONCAT44(local_88._4_4_,UVar3 + 8);
  pUVar4 = ms->hashTable;
  pBVar13 = ms->tagTable;
  local_b0 = ms;
  local_98 = (int *)src;
  local_68 = seqStore;
  local_38 = rep;
  for (; uVar18 < uVar15 + uVar8; uVar18 = uVar18 + 1) {
    if (0x20 < (uint)local_88) {
LAB_001c5841:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    if (local_a4 == 5) {
      uVar11 = *(long *)(local_80 + uVar18) * -0x30e4432345000000;
LAB_001c4f08:
      uVar11 = (uVar11 ^ local_b0->hashSalt) >> ((byte)local_a0 & 0x3f);
    }
    else {
      if (local_a4 == 6) {
        uVar11 = *(long *)(local_80 + uVar18) * -0x30e4432340650000;
        goto LAB_001c4f08;
      }
      uVar11 = (ulong)((*(int *)(local_80 + uVar18) * -0x61c8864f ^ (uint)local_b0->hashSalt) >>
                      ((byte)local_78 & 0x1f));
    }
    uVar14 = ((uint)(uVar11 >> 8) & 0xffffff) << ((byte)local_b4 & 0x1f);
    if (((ulong)(pUVar4 + uVar14) & 0x3f) != 0) {
LAB_001c5860:
      __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x32e,"void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                   );
    }
    iVar17 = ZSTD_isAligned(pBVar13 + uVar14,local_48);
    if (iVar17 == 0) {
LAB_001c587f:
      __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x32f,"void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                   );
    }
    local_b0->hashCache[(uint)uVar18 & 7] = (U32)uVar11;
  }
  local_50 = pInLimit + -8;
  ms_00 = local_b0;
  uVar14 = local_a4;
  uVar15 = local_b4;
  uVar8 = local_a8;
  do {
    local_a8 = uVar8;
    local_88 = -(ulong)local_b8;
    while( true ) {
      if (local_70 <= ip_00) {
        if (local_5c <= local_54) {
          local_5c = 0;
        }
        uVar8 = local_5c;
        if (local_b8 != 0) {
          uVar8 = local_58;
        }
        if (local_58 <= local_54) {
          uVar8 = local_5c;
          local_58 = 0;
        }
        if (local_b8 != 0) {
          local_58 = local_b8;
        }
        if (local_a8 != 0) {
          uVar8 = local_a8;
        }
        *local_38 = local_58;
        local_38[1] = uVar8;
        return (long)pInLimit - (long)local_98;
      }
      if (local_b8 == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = 0;
        if (*(int *)((long)ip_00 + local_88 + 1) == *(int *)((long)ip_00 + 1)) {
          sVar9 = ZSTD_count((BYTE *)((long)ip_00 + 5),(BYTE *)((long)ip_00 + local_88 + 5),
                             (BYTE *)pInLimit);
          uVar18 = sVar9 + 4;
        }
      }
      offbaseFound = 999999999;
      if (uVar14 == 6) {
        if (uVar15 == 6) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_6_6
                             (ms_00,(BYTE *)ip_00,(BYTE *)pInLimit,&offbaseFound);
        }
        else if (uVar15 == 5) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_6_5
                             (ms_00,(BYTE *)ip_00,(BYTE *)pInLimit,&offbaseFound);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_noDict_6_4
                             (ms_00,(BYTE *)ip_00,(BYTE *)pInLimit,&offbaseFound);
        }
      }
      else if (uVar14 == 5) {
        if (uVar15 == 6) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_5_6
                             (ms_00,(BYTE *)ip_00,(BYTE *)pInLimit,&offbaseFound);
        }
        else if (uVar15 == 5) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_5_5
                             (ms_00,(BYTE *)ip_00,(BYTE *)pInLimit,&offbaseFound);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_noDict_5_4
                             (ms_00,(BYTE *)ip_00,(BYTE *)pInLimit,&offbaseFound);
        }
      }
      else if (uVar15 == 6) {
        uVar11 = ZSTD_RowFindBestMatch_noDict_4_6
                           (ms_00,(BYTE *)ip_00,(BYTE *)pInLimit,&offbaseFound);
      }
      else if (uVar15 == 5) {
        uVar11 = ZSTD_RowFindBestMatch_noDict_4_5
                           (ms_00,(BYTE *)ip_00,(BYTE *)pInLimit,&offbaseFound);
      }
      else {
        uVar11 = ZSTD_RowFindBestMatch_noDict_4_4
                           (ms_00,(BYTE *)ip_00,(BYTE *)pInLimit,&offbaseFound);
      }
      uVar12 = uVar18;
      if (uVar18 < uVar11) {
        uVar12 = uVar11;
      }
      if (3 < uVar12) break;
      uVar18 = (long)ip_00 - (long)local_98;
      ip_00 = (int *)((long)ip_00 + (uVar18 >> 8) + 1);
      ms_00->lazySkipping = (uint)(0x7ff < uVar18);
    }
    iend = (int *)((long)ip_00 + 1);
    uVar16 = 1;
    if (uVar18 < uVar11) {
      iend = ip_00;
      uVar16 = offbaseFound;
    }
    pBVar13 = (BYTE *)((long)ip_00 + 5);
    while (pBVar13 + -5 < local_70) {
      ip = (int *)(pBVar13 + -4);
      local_a0 = iend;
      local_78 = pBVar13;
      if (uVar16 == 0) {
        uVar16 = 0;
      }
      else if ((local_b8 != 0) && (*(int *)(pBVar13 + -4) == *(int *)(pBVar13 + (local_88 - 4)))) {
        sVar9 = ZSTD_count(pBVar13,pBVar13 + local_88,(BYTE *)pInLimit);
        uVar8 = ZSTD_highbit32((U32)uVar16);
        if ((sVar9 < 0xfffffffffffffffc) &&
           ((int)(((int)uVar12 * 3 - uVar8) + 1) < (int)(sVar9 + 4) * 3)) {
          uVar16 = 1;
          local_a0 = ip;
          uVar12 = sVar9 + 4;
        }
      }
      offbaseFound = 999999999;
      if (local_a4 == 6) {
        if (local_b4 == 6) {
          uVar18 = ZSTD_RowFindBestMatch_noDict_6_6
                             (local_b0,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else if (local_b4 == 5) {
          uVar18 = ZSTD_RowFindBestMatch_noDict_6_5
                             (local_b0,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else {
          uVar18 = ZSTD_RowFindBestMatch_noDict_6_4
                             (local_b0,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
      }
      else if (local_a4 == 5) {
        if (local_b4 == 6) {
          uVar18 = ZSTD_RowFindBestMatch_noDict_5_6
                             (local_b0,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else if (local_b4 == 5) {
          uVar18 = ZSTD_RowFindBestMatch_noDict_5_5
                             (local_b0,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else {
          uVar18 = ZSTD_RowFindBestMatch_noDict_5_4
                             (local_b0,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
      }
      else if (local_b4 == 6) {
        uVar18 = ZSTD_RowFindBestMatch_noDict_4_6
                           (local_b0,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else if (local_b4 == 5) {
        uVar18 = ZSTD_RowFindBestMatch_noDict_4_5
                           (local_b0,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else {
        uVar18 = ZSTD_RowFindBestMatch_noDict_4_4
                           (local_b0,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      sVar9 = offbaseFound;
      uVar8 = ZSTD_highbit32((U32)offbaseFound);
      uVar14 = ZSTD_highbit32((U32)uVar16);
      iend = local_a0;
      uVar15 = local_b4;
      if ((uVar18 < 4) || ((int)((int)uVar18 * 4 - uVar8) <= (int)(((int)uVar12 * 4 - uVar14) + 4)))
      break;
      iend = (int *)((long)ip_00 + 1);
      ip_00 = iend;
      uVar12 = uVar18;
      uVar16 = sVar9;
      pBVar13 = local_78 + 1;
    }
    psVar19 = local_68;
    uVar14 = local_a4;
    uVar8 = local_a8;
    if (3 < uVar16) {
      for (; ((local_98 < iend && (local_40 < (BYTE *)((long)iend + (3 - uVar16)))) &&
             (*(BYTE *)((long)iend + -1) == *(BYTE *)((long)iend + (2 - uVar16))));
          iend = (int *)((long)iend + -1)) {
        uVar12 = uVar12 + 1;
      }
      uVar8 = local_b8;
      local_b8 = (U32)uVar16 - 3;
    }
    if (local_68->maxNbSeq <=
        (ulong)((long)local_68->sequences - (long)local_68->sequencesStart >> 3)) {
LAB_001c58dc:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    local_a8 = uVar8;
    if (0x20000 < local_68->maxNbLit) {
LAB_001c591a:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar18 = (long)iend - (long)local_98;
    pBVar13 = local_68->lit;
    if (local_68->litStart + local_68->maxNbLit < pBVar13 + uVar18) {
LAB_001c58fb:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pInLimit < iend) {
LAB_001c58bd:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    local_a0 = iend;
    if (local_50 < iend) {
      ZSTD_safecopyLiterals(pBVar13,(BYTE *)local_98,(BYTE *)iend,(BYTE *)local_50);
LAB_001c542a:
      psVar19->lit = psVar19->lit + uVar18;
      if (0xffff < uVar18) {
        if (psVar19->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar19->longLengthType = ZSTD_llt_literalLength;
        psVar19->longLengthPos =
             (U32)((ulong)((long)psVar19->sequences - (long)psVar19->sequencesStart) >> 3);
      }
    }
    else {
      uVar6 = *(undefined8 *)(local_98 + 2);
      *(undefined8 *)pBVar13 = *(undefined8 *)local_98;
      *(undefined8 *)(pBVar13 + 8) = uVar6;
      pBVar13 = local_68->lit;
      if (0x10 < uVar18) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar13 + 0x10 + (-0x10 - (long)(local_98 + 4))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar6 = *(undefined8 *)(local_98 + 6);
        *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)(local_98 + 4);
        *(undefined8 *)(pBVar13 + 0x18) = uVar6;
        if (0x20 < (long)uVar18) {
          lVar10 = 0;
          do {
            puVar2 = (undefined8 *)((long)local_98 + lVar10 + 0x20);
            uVar6 = puVar2[1];
            pBVar1 = pBVar13 + lVar10 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar6;
            puVar2 = (undefined8 *)((long)local_98 + lVar10 + 0x30);
            uVar6 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar6;
            lVar10 = lVar10 + 0x20;
          } while (pBVar1 + 0x20 < pBVar13 + uVar18);
        }
        goto LAB_001c542a;
      }
      local_68->lit = pBVar13 + uVar18;
    }
    psVar5 = psVar19->sequences;
    psVar5->litLength = (U16)uVar18;
    psVar5->offBase = (U32)uVar16;
    if (uVar12 < 3) {
LAB_001c589e:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar12 - 3) {
      if (psVar19->longLengthType != ZSTD_llt_none) {
LAB_001c5939:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      psVar19->longLengthType = ZSTD_llt_matchLength;
      psVar19->longLengthPos = (U32)((ulong)((long)psVar5 - (long)psVar19->sequencesStart) >> 3);
    }
    psVar5->mlBase = (U16)(uVar12 - 3);
    psVar19->sequences = psVar5 + 1;
    if (local_b0->lazySkipping != 0) {
      uVar8 = local_b0->nextToUpdate;
      uVar18 = (ulong)uVar8;
      UVar3 = local_b0->rowHashLog;
      uVar14 = ((int)local_70 - (int)(local_80 + uVar18)) + 1;
      if (7 < uVar14) {
        uVar14 = 8;
      }
      if (local_70 < local_80 + uVar18) {
        uVar14 = 0;
      }
      pUVar4 = local_b0->hashTable;
      pBVar13 = local_b0->tagTable;
      local_98 = (int *)CONCAT44(local_98._4_4_,UVar3 + 8);
      local_88 = (ulong)(0x38 - UVar3);
      local_78 = (BYTE *)CONCAT44(local_78._4_4_,0x18 - UVar3);
      for (; uVar18 < uVar14 + uVar8; uVar18 = uVar18 + 1) {
        if (0x20 < (uint)local_98) goto LAB_001c5841;
        if (local_a4 == 5) {
          uVar11 = *(long *)(local_80 + uVar18) * -0x30e4432345000000;
LAB_001c560a:
          uVar11 = (uVar11 ^ local_b0->hashSalt) >> ((byte)local_88 & 0x3f);
        }
        else {
          if (local_a4 == 6) {
            uVar11 = *(long *)(local_80 + uVar18) * -0x30e4432340650000;
            goto LAB_001c560a;
          }
          uVar11 = (ulong)((*(int *)(local_80 + uVar18) * -0x61c8864f ^ (uint)local_b0->hashSalt) >>
                          ((byte)local_78 & 0x1f));
        }
        uVar15 = ((uint)(uVar11 >> 8) & 0xffffff) << ((byte)local_b4 & 0x1f);
        if (((ulong)(pUVar4 + uVar15) & 0x3f) != 0) goto LAB_001c5860;
        iVar17 = ZSTD_isAligned(pBVar13 + uVar15,local_48);
        if (iVar17 == 0) goto LAB_001c587f;
        local_b0->hashCache[(uint)uVar18 & 7] = (U32)uVar11;
      }
      local_b0->lazySkipping = 0;
      psVar19 = local_68;
      uVar14 = local_a4;
      uVar15 = local_b4;
    }
    ms_00 = local_b0;
    ip_00 = (int *)((long)local_a0 + uVar12);
    uVar7 = local_a8;
    while (((uVar8 = uVar7, local_98 = ip_00, uVar8 != 0 && (ip_00 <= local_70)) &&
           (*ip_00 == *(int *)((long)ip_00 - (ulong)uVar8)))) {
      sVar9 = ZSTD_count((BYTE *)(ip_00 + 1),(BYTE *)((long)ip_00 + (4 - (ulong)uVar8)),
                         (BYTE *)pInLimit);
      if (psVar19->maxNbSeq <=
          (ulong)((long)psVar19->sequences - (long)psVar19->sequencesStart >> 3)) goto LAB_001c58dc;
      if (0x20000 < psVar19->maxNbLit) goto LAB_001c591a;
      pBVar13 = psVar19->lit;
      if (psVar19->litStart + psVar19->maxNbLit < pBVar13) goto LAB_001c58fb;
      if (pInLimit < local_98) goto LAB_001c58bd;
      if (local_50 < local_98) {
        ZSTD_safecopyLiterals(pBVar13,(BYTE *)local_98,(BYTE *)local_98,(BYTE *)local_50);
      }
      else {
        uVar6 = *(undefined8 *)(local_98 + 2);
        *(undefined8 *)pBVar13 = *(undefined8 *)local_98;
        *(undefined8 *)(pBVar13 + 8) = uVar6;
      }
      psVar5 = psVar19->sequences;
      psVar5->litLength = 0;
      psVar5->offBase = 1;
      if (sVar9 + 4 < 3) goto LAB_001c589e;
      if (0xffff < sVar9 + 1) {
        if (psVar19->longLengthType != ZSTD_llt_none) goto LAB_001c5939;
        psVar19->longLengthType = ZSTD_llt_matchLength;
        psVar19->longLengthPos = (U32)((ulong)((long)psVar5 - (long)psVar19->sequencesStart) >> 3);
      }
      psVar5->mlBase = (U16)(sVar9 + 1);
      psVar19->sequences = psVar5 + 1;
      uVar7 = local_b8;
      local_b8 = uVar8;
      ip_00 = (int *)((long)local_98 + sVar9 + 4);
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_noDict);
}